

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_4::Validator::OnGlobalSetExpr(Validator *this,GlobalSetExpr *expr)

{
  Result RVar1;
  Var VStack_68;
  
  Var::Var(&VStack_68,&expr->var);
  RVar1 = SharedValidator::OnGlobalSet
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)21>).super_Expr.loc,
                     &VStack_68);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&VStack_68);
  return (Result)Ok;
}

Assistant:

Result Validator::OnGlobalSetExpr(GlobalSetExpr* expr) {
  result_ |= validator_.OnGlobalSet(expr->loc, expr->var);
  return Result::Ok;
}